

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20250127::Cord::SetCrcCordState(Cord *this,CrcCordState *state)

{
  byte bVar1;
  undefined8 uVar2;
  CordzUpdateScope CVar3;
  ulong uVar4;
  CordRep *pCVar5;
  CordRepCrc *pCVar6;
  long sampling_stride;
  CrcCordState *this_00;
  ulong uVar7;
  long *in_FS_OFFSET;
  CordzUpdateScope scope;
  CrcCordState local_40;
  CordzUpdateScope local_38;
  CrcCordState local_30;
  CrcCordState local_28;
  
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  uVar7 = (ulong)(char)bVar1;
  if ((uVar7 & 1) == 0) {
    uVar4 = uVar7 >> 1;
  }
  else {
    uVar4 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar4 == 0) {
    pCVar5 = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if ((pCVar5 != (CordRep *)0x0 && (bVar1 & 1) != 0) && (pCVar5->length == 0)) {
      SetCrcCordState();
    }
    crc_internal::CrcCordState::CrcCordState(&local_28,state);
    pCVar6 = cord_internal::CordRepCrc::New((CordRep *)0x0,&local_28);
    this_00 = &local_28;
  }
  else {
    if ((uVar7 & 1) != 0) {
      local_38.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
      if (local_38.info_ != (CordzInfo *)0x0) {
        cord_internal::CordzInfo::Lock(local_38.info_,kSetExpectedChecksum);
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x274,"CordRep *absl::cord_internal::InlineData::as_tree() const");
      }
      pCVar5 = (this->contents_).data_.rep_.field_0.as_tree.rep;
      crc_internal::CrcCordState::CrcCordState(&local_40,state);
      pCVar6 = cord_internal::CordRepCrc::New(pCVar5,&local_40);
      crc_internal::CrcCordState::~CrcCordState(&local_40);
      CVar3.info_ = local_38.info_;
      if (pCVar6 == (CordRepCrc *)0x0) {
        __assert_fail("rep",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x4f6,
                      "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
        (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar6->super_CordRep;
        if (local_38.info_ != (CordzInfo *)0x0) {
          Mutex::AssertHeld(&(local_38.info_)->mutex_);
          (CVar3.info_)->rep_ = &pCVar6->super_CordRep;
        }
        cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_38);
        return;
      }
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f7,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    pCVar5 = &cord_internal::CordRepFlat::NewImpl<4096ul>(uVar7 >> 1)->super_CordRep;
    pCVar5->length = uVar7 >> 1;
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      __assert_fail("!is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x28e,"void absl::cord_internal::InlineData::copy_max_inline_to(char *) const")
      ;
    }
    uVar2 = *(undefined8 *)((long)&(this->contents_).data_.rep_.field_0.as_tree.cordz_info + 1);
    *(CordRep **)((long)&pCVar5[1].length + 4) = (this->contents_).data_.rep_.field_0.as_tree.rep;
    *(undefined8 *)pCVar5->storage = uVar2;
    crc_internal::CrcCordState::CrcCordState(&local_30,state);
    pCVar6 = cord_internal::CordRepCrc::New(pCVar5,&local_30);
    this_00 = &local_30;
  }
  crc_internal::CrcCordState::~CrcCordState(this_00);
  if (pCVar6 != (CordRepCrc *)0x0) {
    (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar6->super_CordRep;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    if (in_FS_OFFSET[-0xb] < 2) {
      sampling_stride =
           cord_internal::cordz_should_profile_slow((SamplingState *)(*in_FS_OFFSET + -0x58));
    }
    else {
      in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
      sampling_stride = 0;
    }
    if (0 < sampling_stride) {
      cord_internal::CordzInfo::TrackCord((InlineData *)this,kSetExpectedChecksum,sampling_stride);
    }
    return;
  }
  __assert_fail("rep",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                ,0x4e8,
                "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
               );
}

Assistant:

void Cord::SetCrcCordState(crc_internal::CrcCordState state) {
  auto constexpr method = CordzUpdateTracker::kSetExpectedChecksum;
  if (empty()) {
    contents_.MaybeRemoveEmptyCrcNode();
    CordRep* rep = CordRepCrc::New(nullptr, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else if (!contents_.is_tree()) {
    CordRep* rep = contents_.MakeFlatWithExtraCapacity(0);
    rep = CordRepCrc::New(rep, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else {
    const CordzUpdateScope scope(contents_.data_.cordz_info(), method);
    CordRep* rep = CordRepCrc::New(contents_.data_.as_tree(), std::move(state));
    contents_.SetTree(rep, scope);
  }
}